

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Teleport.cpp
# Opt level: O2

int Teleport::GetFloatParameterCallback
              (UnityAudioEffectState *state,int index,float *value,char *valuestr)

{
  int iVar1;
  EffectData *pEVar2;
  SharedMemoryHandle *pSVar3;
  Parameter *pPVar4;
  uint uVar5;
  
  pEVar2 = UnityAudioEffectState::GetEffectData<Teleport::EffectData>(state);
  if (index < 8) {
    if (value != (float *)0x0) {
      if (index < 4) {
        pPVar4 = (Parameter *)(pEVar2->p + index);
      }
      else {
        uVar5 = (uint)pEVar2->p[0];
        if ((int)uVar5 < 0) {
          __assert_fail("stream >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/Plugin_Teleport.cpp"
                        ,0x81,
                        "int Teleport::GetFloatParameterCallback(UnityAudioEffectState *, int, float *, char *)"
                       );
        }
        if (7 < uVar5) {
          __assert_fail("stream < Teleport::NUMSTREAMS",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/Plugin_Teleport.cpp"
                        ,0x82,
                        "int Teleport::GetFloatParameterCallback(UnityAudioEffectState *, int, float *, char *)"
                       );
        }
        pSVar3 = GetSharedMemory();
        pPVar4 = pSVar3->data->streams[uVar5].params + (index - 4);
      }
      *value = pPVar4->value;
    }
    iVar1 = 0;
    if (valuestr != (char *)0x0) {
      *valuestr = '\0';
    }
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK GetFloatParameterCallback(UnityAudioEffectState* state, int index, float* value, char *valuestr)
    {
        EffectData* data = state->GetEffectData<EffectData>();

        if (index >= P_NUM)
            return UNITY_AUDIODSP_ERR_UNSUPPORTED;

        if (value != NULL)
        {
            if (index >= P_PARAM1 && index <= P_PARAM4)
            {
                int stream = (int)data->p[P_STREAM];
                assert(stream >= 0);
                assert(stream < Teleport::NUMSTREAMS);

                SharedMemoryHandle& shared = GetSharedMemory();
                Stream& s = shared->streams[stream];

                *value = s.params[index - P_PARAM1].value;
            }
            else
                *value = data->p[index];
        }

        if (valuestr != NULL)
            valuestr[0] = 0;

        return UNITY_AUDIODSP_OK;
    }